

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O0

void __thiscall
xe::ContainerFormatParser::feed(ContainerFormatParser *this,deUint8 *bytes,size_t numBytes)

{
  int iVar1;
  int iVar2;
  int count;
  size_t numBytes_local;
  deUint8 *bytes_local;
  ContainerFormatParser *this_local;
  
  iVar1 = de::RingBuffer<unsigned_char>::getNumFree(&this->m_buf);
  count = (int)numBytes;
  if (iVar1 < count) {
    iVar1 = de::RingBuffer<unsigned_char>::getSize(&this->m_buf);
    iVar2 = de::RingBuffer<unsigned_char>::getNumElements(&this->m_buf);
    iVar1 = getNextBufferSize(iVar1,iVar2 + count);
    de::RingBuffer<unsigned_char>::resize(&this->m_buf,iVar1);
  }
  de::RingBuffer<unsigned_char>::pushFront(&this->m_buf,bytes,count);
  if (this->m_element == CONTAINERELEMENT_INCOMPLETE) {
    advance(this);
  }
  return;
}

Assistant:

void ContainerFormatParser::feed (const deUint8* bytes, size_t numBytes)
{
	// Grow buffer if necessary.
	if (m_buf.getNumFree() < (int)numBytes)
		m_buf.resize(getNextBufferSize(m_buf.getSize(), m_buf.getNumElements()+(int)numBytes));

	// Append to front.
	m_buf.pushFront(bytes, (int)numBytes);

	// If we haven't parsed complete element, re-try after data feed.
	if (m_element == CONTAINERELEMENT_INCOMPLETE)
		advance();
}